

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_computeBasisInverseRational
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  Status SVar2;
  Verbosity VVar3;
  int *piVar4;
  SVectorRational *pSVar5;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  **ppSVar6;
  UnitVectorRational *pUVar7;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar8;
  Real RVar9;
  double extraout_XMM0_Qa;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int i;
  Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  matrix;
  int matrixdim;
  int in_stack_0000018c;
  SVectorRational **in_stack_00000190;
  SLUFactorRational *in_stack_00000198;
  char *in_stack_ffffffffffffff58;
  SPxOut *pSVar10;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  SLUFactorRational *this_00;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff88;
  Verbosity local_48;
  Verbosity local_44 [3];
  int local_38;
  int local_c;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_c = numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x7cd381);
  Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::Array(in_stack_ffffffffffffff70,iVar1);
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_ffffffffffffff60,
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
    piVar4 = DataArray<int>::operator[](&in_RDI->_rationalLUSolverBind,local_38);
    if (*piVar4 < 0) {
      DataArray<int>::operator[](&in_RDI->_rationalLUSolverBind,local_38);
      pUVar7 = _unitVectorRational(in_stack_ffffffffffffff88,
                                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      ppSVar6 = Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
                ::operator[]((Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
                              *)in_stack_ffffffffffffff60,
                             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      *ppSVar6 = &pUVar7->
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ;
    }
    else {
      DataArray<int>::operator[](&in_RDI->_rationalLUSolverBind,local_38);
      pSVar5 = colVectorRational(in_stack_ffffffffffffff60,
                                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      ppSVar6 = Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
                ::operator[]((Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
                              *)in_stack_ffffffffffffff60,
                             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      *ppSVar6 = pSVar5;
    }
  }
  RVar8 = realParam(in_RDI,TIMELIMIT);
  RVar9 = realParam(in_RDI,INFTY);
  if (RVar9 <= RVar8) {
    SLUFactorRational::setTimeLimit(&in_RDI->_rationalLUSolver,-1.0);
  }
  else {
    this_00 = &in_RDI->_rationalLUSolver;
    RVar8 = realParam(in_RDI,TIMELIMIT);
    (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
    SLUFactorRational::setTimeLimit(this_00,RVar8 - extraout_XMM0_Qa);
  }
  Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::get_ptr((Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
             *)0x7cd564);
  SLUFactorRational::load(in_stack_00000198,in_stack_00000190,in_stack_0000018c);
  RVar8 = SLUFactorRational::getFactorTime((SLUFactorRational *)0x7cd58b);
  in_RDI->_statistics->luFactorizationTimeRational =
       in_RDI->_statistics->luFactorizationTimeRational + RVar8;
  iVar1 = SLUFactorRational::getFactorCount(&in_RDI->_rationalLUSolver);
  in_RDI->_statistics->luFactorizationsRational =
       in_RDI->_statistics->luFactorizationsRational + iVar1;
  SLUFactorRational::resetCounters((SLUFactorRational *)in_stack_ffffffffffffff60);
  SVar2 = SLUFactorRational::status(&in_RDI->_rationalLUSolver);
  if (SVar2 == TIME) {
    if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0xfffffffffffffff8) &&
       (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 3 < (int)VVar3)) {
      pSVar10 = &in_RDI->spxout;
      local_44[2] = SPxOut::getVerbosity(pSVar10);
      local_44[1] = 4;
      SPxOut::setVerbosity(pSVar10,local_44 + 1);
      soplex::operator<<(pSVar10,in_stack_ffffffffffffff58);
      SPxOut::setVerbosity(&in_RDI->spxout,local_44 + 2);
    }
  }
  else {
    SVar2 = SLUFactorRational::status(&in_RDI->_rationalLUSolver);
    if (((SVar2 != OK) &&
        (in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0xfffffffffffffff8)) &&
       (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
      pSVar10 = &in_RDI->spxout;
      local_44[0] = SPxOut::getVerbosity(pSVar10);
      local_48 = INFO1;
      SPxOut::setVerbosity(pSVar10,&local_48);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffff60,(char *)pSVar10);
      SPxOut::setVerbosity(&in_RDI->spxout,local_44);
    }
  }
  Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::~Array((Array<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
            *)0x7cd72b);
  return;
}

Assistant:

void SoPlexBase<R>::_computeBasisInverseRational()
{
   assert(_rationalLUSolver.status() == SLinSolverRational::UNLOADED
          || _rationalLUSolver.status() == SLinSolverRational::TIME);

   const int matrixdim = numRowsRational();
   assert(_rationalLUSolverBind.size() == matrixdim);

   Array< const SVectorRational* > matrix(matrixdim);
   _rationalLUSolverBind.reSize(matrixdim);

   for(int i = 0; i < matrixdim; i++)
   {
      if(_rationalLUSolverBind[i] >= 0)
      {
         assert(_rationalLUSolverBind[i] < numColsRational());
         matrix[i] = &colVectorRational(_rationalLUSolverBind[i]);
      }
      else
      {
         assert(-1 - _rationalLUSolverBind[i] >= 0);
         assert(-1 - _rationalLUSolverBind[i] < numRowsRational());
         matrix[i] = _unitVectorRational(-1 - _rationalLUSolverBind[i]);
      }
   }

   // load and factorize rational basis matrix
   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _rationalLUSolver.setTimeLimit((double)realParam(SoPlexBase<R>::TIMELIMIT) -
                                     _statistics->solvingTime->time());
   else
      _rationalLUSolver.setTimeLimit(-1.0);

   _rationalLUSolver.load(matrix.get_ptr(), matrixdim);

   // record statistics
   _statistics->luFactorizationTimeRational += _rationalLUSolver.getFactorTime();
   _statistics->luFactorizationsRational += _rationalLUSolver.getFactorCount();
   _rationalLUSolver.resetCounters();

   if(_rationalLUSolver.status() == SLinSolverRational::TIME)
   {
      SPX_MSG_INFO2(spxout, spxout << "Rational factorization hit time limit.\n");
   }
   else if(_rationalLUSolver.status() != SLinSolverRational::OK)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error performing rational LU factorization.\n");
   }

   return;
}